

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

uint32_t __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_uint32
          (GLAttributeBuffer *this,size_t ind)

{
  RenderDataType RVar1;
  uint uVar2;
  AttributeBuffer *in_RDI;
  size_t in_stack_00000008;
  GLAttributeBuffer *in_stack_00000010;
  allocator local_31;
  string local_30 [48];
  
  RVar1 = AttributeBuffer::getType(in_RDI);
  if (RVar1 != UInt) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"bad getData type",&local_31);
    exception((string *)in_stack_00000010);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  uVar2 = getData_helper<unsigned_int>(in_stack_00000010,in_stack_00000008);
  return uVar2;
}

Assistant:

uint32_t GLAttributeBuffer::getData_uint32(size_t ind) {
  if (getType() != RenderDataType::UInt) exception("bad getData type");
  return getData_helper<uint32_t>(ind);
}